

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::GenerateCPackPropertiesFile(cmGlobalGenerator *this)

{
  bool bVar1;
  InstalledFilesMap *this_00;
  reference this_01;
  pointer pcVar2;
  cmMakefile *this_02;
  string *a;
  reference ppVar3;
  undefined1 local_3b0 [8];
  cmCPackPropertiesGenerator cpackPropertiesGenerator;
  cmInstalledFile *installedFile;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>
  *i;
  const_iterator __end1;
  const_iterator __begin1;
  InstalledFilesMap *__range1;
  cmGeneratedFileStream file;
  undefined1 local_98 [8];
  string path;
  undefined1 local_68 [8];
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmMakefile *mf;
  value_type *lg;
  InstalledFilesMap *installedFiles;
  cmGlobalGenerator *this_local;
  
  this_00 = cmake::GetInstalledFiles_abi_cxx11_(this->CMakeInstance);
  this_01 = std::
            vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ::operator[](&this->LocalGenerators,0);
  pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                     (this_01);
  this_02 = cmLocalGenerator::GetMakefile(pcVar2);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&config.field_2 + 8),this_02,OnlyMultiConfig);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_((string *)local_68,this_02);
  a = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[23]>
            ((string *)local_98,a,(char (*) [23])"/CPackProperties.cmake");
  bVar1 = cmsys::SystemTools::FileExists((string *)local_98);
  if ((bVar1) ||
     (bVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
              ::empty(this_00), !bVar1)) {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&__range1,(string *)local_98,false,None);
    std::operator<<((ostream *)&__range1,"# CPack properties\n");
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
             ::begin(this_00);
    i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
           ::end(this_00);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>
               ::operator*(&__end1);
      cpackPropertiesGenerator.InstalledFile = &ppVar3->second;
      pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::get
                         (this_01);
      cmCPackPropertiesGenerator::cmCPackPropertiesGenerator
                ((cmCPackPropertiesGenerator *)local_3b0,pcVar2,
                 cpackPropertiesGenerator.InstalledFile,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&config.field_2 + 8));
      cmScriptGenerator::Generate
                ((cmScriptGenerator *)local_3b0,(ostream *)&__range1,(string *)local_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&config.field_2 + 8));
      cmCPackPropertiesGenerator::~cmCPackPropertiesGenerator
                ((cmCPackPropertiesGenerator *)local_3b0);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>
      ::operator++(&__end1);
    }
    file._612_4_ = 1;
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range1);
  }
  else {
    file._612_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&config.field_2 + 8));
  return true;
}

Assistant:

bool cmGlobalGenerator::GenerateCPackPropertiesFile()
{
  cmake::InstalledFilesMap const& installedFiles =
    this->CMakeInstance->GetInstalledFiles();

  const auto& lg = this->LocalGenerators[0];
  cmMakefile* mf = lg->GetMakefile();

  std::vector<std::string> configs =
    mf->GetGeneratorConfigs(cmMakefile::OnlyMultiConfig);
  std::string config = mf->GetDefaultConfiguration();

  std::string path = cmStrCat(this->CMakeInstance->GetHomeOutputDirectory(),
                              "/CPackProperties.cmake");

  if (!cmSystemTools::FileExists(path) && installedFiles.empty()) {
    return true;
  }

  cmGeneratedFileStream file(path);
  file << "# CPack properties\n";

  for (auto const& i : installedFiles) {
    cmInstalledFile const& installedFile = i.second;

    cmCPackPropertiesGenerator cpackPropertiesGenerator(
      lg.get(), installedFile, configs);

    cpackPropertiesGenerator.Generate(file, config, configs);
  }

  return true;
}